

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall ipx::Model::EquilibrateMatrix(Model *this)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  pointer pdVar4;
  double *pdVar5;
  size_t __n;
  valarray<double> *pvVar6;
  valarray<double> *pvVar7;
  int exp;
  int exp_00;
  bool bVar8;
  ulong uVar9;
  valarray<double> *pvVar10;
  double *pdVar11;
  Int i;
  int iVar12;
  ulong uVar13;
  valarray<double> *pvVar14;
  long lVar15;
  uint uVar16;
  valarray<double> *pvVar17;
  double dVar18;
  double dVar19;
  int exp_1;
  Vector colmax;
  Vector rowmax;
  double local_88;
  valarray<double> local_80;
  valarray<double> *local_70;
  valarray<double> *local_68;
  size_t local_60;
  valarray<double> local_58;
  Model *local_48;
  size_t local_40;
  valarray<double> *local_38;
  
  local_60 = (size_t)(this->A_).nrow_;
  piVar2 = (this->A_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar16 = (int)((ulong)((long)(this->A_).colptr_.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)piVar2) >> 2) - 1;
  piVar3 = (this->A_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (this->A_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_68 = &this->colscale_;
  uVar9 = 0;
  std::valarray<double>::resize(local_68,0,0.0);
  local_38 = &this->rowscale_;
  local_48 = this;
  std::valarray<double>::resize(local_38,0,0.0);
  local_40 = (size_t)(int)uVar16;
  uVar13 = 0;
  local_70 = (valarray<double> *)(ulong)uVar16;
  if (0 < piVar2[local_40]) {
    uVar13 = (ulong)(uint)piVar2[local_40];
  }
  do {
    if (uVar13 == uVar9) {
      return;
    }
    frexp(ABS(pdVar4[uVar9]),(int *)&local_80);
    pvVar17 = local_68;
    uVar9 = uVar9 + 1;
  } while ((uint)local_80._M_size < 4);
  std::valarray<double>::resize(local_68,local_40,0.0);
  pvVar10 = local_38;
  __n = local_60;
  std::valarray<double>::resize(local_38,local_60,0.0);
  local_80._M_size = 0x3ff0000000000000;
  std::valarray<double>::operator=(pvVar17,(double *)&local_80);
  local_80._M_size = 0x3ff0000000000000;
  std::valarray<double>::operator=(pvVar10,(double *)&local_80);
  std::valarray<double>::valarray(&local_80,local_40);
  std::valarray<double>::valarray(&local_58,__n);
  pvVar17 = (valarray<double> *)0x0;
  iVar12 = (int)local_70;
  local_70 = (valarray<double> *)((ulong)local_70 & 0xffffffff);
  if (iVar12 < 1) {
    local_70 = pvVar17;
  }
  pvVar10 = (valarray<double> *)(__n & 0xffffffff);
  if ((int)__n < 1) {
    pvVar10 = pvVar17;
  }
  local_60 = (long)local_70 * 8;
  while (pvVar14 = local_70, (int)pvVar17 != 10) {
    local_88 = 0.0;
    pdVar11 = &local_88;
    std::valarray<double>::operator=(&local_58,&local_88);
    pvVar6 = (valarray<double> *)0x0;
    while (pvVar7 = pvVar6, pvVar7 != pvVar14) {
      local_80._M_data[(long)pvVar7] = 0.0;
      iVar12 = piVar2[(long)((long)&pvVar7->_M_size + 1)];
      for (pdVar11 = (double *)(long)piVar2[(long)pvVar7];
          pvVar6 = (valarray<double> *)((long)&pvVar7->_M_size + 1), (long)pdVar11 < (long)iVar12;
          pdVar11 = (double *)((long)pdVar11 + 1)) {
        iVar1 = piVar3[(long)pdVar11];
        dVar18 = ABS(pdVar4[(long)pdVar11]);
        dVar19 = dVar18;
        if (dVar18 <= local_80._M_data[(long)pvVar7]) {
          dVar19 = local_80._M_data[(long)pvVar7];
        }
        local_80._M_data[(long)pvVar7] = dVar19;
        if (dVar18 <= local_58._M_data[iVar1]) {
          dVar18 = local_58._M_data[iVar1];
        }
        local_58._M_data[iVar1] = dVar18;
      }
    }
    bVar8 = false;
    local_68 = pvVar17;
    for (pvVar14 = (valarray<double> *)0x0; pvVar10 != pvVar14;
        pvVar14 = (valarray<double> *)((long)&pvVar14->_M_size + 1)) {
      frexp(local_58._M_data[(long)pvVar14],(int *)&local_88);
      dVar18 = EquilibrationFactor(local_88._0_4_,(int)pdVar11,exp);
      local_58._M_data[(long)pvVar14] = dVar18;
      if ((dVar18 != 1.0) || (NAN(dVar18))) {
        pdVar5 = (local_48->rowscale_)._M_data;
        pdVar5[(long)pvVar14] = dVar18 * pdVar5[(long)pvVar14];
        bVar8 = true;
      }
    }
    for (lVar15 = 0; local_60 != lVar15; lVar15 = lVar15 + 8) {
      frexp(*(double *)((long)local_80._M_data + lVar15),(int *)&local_88);
      dVar18 = EquilibrationFactor(local_88._0_4_,(int)pdVar11,exp_00);
      *(double *)((long)local_80._M_data + lVar15) = dVar18;
      if ((dVar18 != 1.0) || (NAN(dVar18))) {
        pdVar5 = (local_48->colscale_)._M_data;
        *(double *)((long)pdVar5 + lVar15) = dVar18 * *(double *)((long)pdVar5 + lVar15);
        bVar8 = true;
      }
    }
    if (!bVar8) break;
    pvVar17 = (valarray<double> *)0x0;
    while (pvVar14 = pvVar17, pvVar14 != local_70) {
      iVar12 = piVar2[(long)((long)&pvVar14->_M_size + 1)];
      for (lVar15 = (long)piVar2[(long)pvVar14];
          pvVar17 = (valarray<double> *)((long)&pvVar14->_M_size + 1), lVar15 < iVar12;
          lVar15 = lVar15 + 1) {
        dVar18 = local_80._M_data[(long)pvVar14];
        dVar19 = pdVar4[lVar15];
        pdVar4[lVar15] = dVar18 * dVar19;
        pdVar4[lVar15] = dVar18 * dVar19 * local_58._M_data[piVar3[lVar15]];
      }
    }
    pvVar17 = (valarray<double> *)(ulong)((int)local_68 + 1);
  }
  operator_delete(local_58._M_data);
  operator_delete(local_80._M_data);
  return;
}

Assistant:

void Model::EquilibrateMatrix() {
    const Int m = A_.rows();
    const Int n = A_.cols();
    const Int* Ap = A_.colptr();
    const Int* Ai = A_.rowidx();
    double* Ax = A_.values();

    colscale_.resize(0);
    rowscale_.resize(0);

    // The absolute value of each nonzero entry of AI can be written as x*2^exp
    // with x in the range [0.5,1). We consider AI well scaled if each entry is
    // such that expmin <= exp <= expmax for parameters expmin and expmax.
    // For example,
    //
    //  expmin  expmax  allowed range
    //  -----------------------------
    //       0       2    [0.5,    4)
    //      -1       3    [0.25,   8)
    //       1       7    [1.0,  128)
    //
    // If AI is not well scaled, a recursive row and column equilibration is
    // applied. In each iteration, the scaling factors are roughly 1/sqrt(max),
    // where max is the maximum row or column entry. However, the factors are
    // truncated to powers of 2, so that no round-off errors occur.

    constexpr int expmin = 0;
    constexpr int expmax = 3;
    constexpr Int maxround = 10;

    // Quick return if entries are within the target range.
    bool out_of_range = false;
    for (Int p = 0; p < Ap[n]; p++) {
        int exp;
        std::frexp(std::abs(Ax[p]), &exp);
        if (exp < expmin || exp > expmax) {
            out_of_range = true;
            break;
        }
    }
    if (!out_of_range)
        return;

    colscale_.resize(n);
    rowscale_.resize(m);
    colscale_ = 1.0;
    rowscale_ = 1.0;
    Vector colmax(n), rowmax(m);

    for (Int round = 0; round < maxround; round++) {
        // Compute infinity norm of each row and column.
        rowmax = 0.0;
        for (Int j = 0; j < n; j++) {
            colmax[j] = 0.0;
            for (Int p = Ap[j]; p < Ap[j+1]; p++) {
                Int i = Ai[p];
                double xa = std::abs(Ax[p]);
                colmax[j] = std::max(colmax[j], xa);
                rowmax[i] = std::max(rowmax[i], xa);
            }
        }
        // Replace rowmax and colmax entries by scaling factors from this round.
        bool out_of_range = false;
        for (Int i = 0; i < m; i++) {
            int exp;
            std::frexp(rowmax[i], &exp);
            rowmax[i] = EquilibrationFactor(expmin, expmax, exp);
            if (rowmax[i] != 1.0) {
                out_of_range = true;
                rowscale_[i] *= rowmax[i];
            }
        }
        for (Int j = 0; j < n; j++) {
            int exp;
            std::frexp(colmax[j], &exp);
            colmax[j] = EquilibrationFactor(expmin, expmax, exp);
            if (colmax[j] != 1.0) {
                out_of_range = true;
                colscale_[j] *= colmax[j];
            }
        }
        if (!out_of_range)
            break;
        // Rescale A.
        for (Int j = 0; j < n; j++) {
            for (Int p = Ap[j]; p < Ap[j+1]; p++) {
                Ax[p] *= colmax[j];     // column scaling
                Ax[p] *= rowmax[Ai[p]]; // row scaling
            }
        }
    }
}